

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other_local;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_local;
  
  if (this != other) {
    deallocate(this);
    move(this,other);
    return this;
  }
  v10::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format.h"
             ,0x3c8,"");
}

Assistant:

auto operator=(basic_memory_buffer&& other) noexcept -> basic_memory_buffer& {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }